

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5UnicodeTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int iUnused,char *pText,int nText,
                       _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  char cVar7;
  byte *pbVar8;
  uint *puVar9;
  byte *pbVar10;
  int iVar11;
  byte *pbVar12;
  uint *local_68;
  int local_5c;
  ulong local_58;
  int local_50;
  uint *local_48;
  
  pbVar10 = (byte *)(pText + nText);
  local_68 = *(uint **)(pTokenizer + 0x80);
  local_58 = (ulong)*(int *)(pTokenizer + 0x88);
  local_48 = (uint *)((long)local_68 + (local_58 - 6));
  pbVar8 = (byte *)pText;
  do {
    while( true ) {
      while( true ) {
        if (pbVar10 <= pbVar8) {
          return 0;
        }
        bVar2 = *pbVar8;
        lVar6 = (long)(char)bVar2;
        local_5c = (int)pbVar8;
        local_50 = (int)pText;
        puVar9 = local_68;
        if (-1 < lVar6) break;
        uVar5 = (uint)bVar2;
        pbVar12 = pbVar8 + 1;
        if (0xbf < bVar2) {
          uVar4 = (uint)""[bVar2 - 0xc0];
          for (; (pbVar12 < pbVar10 && ((*pbVar12 & 0xffffffc0) == 0x80)); pbVar12 = pbVar12 + 1) {
            uVar4 = uVar4 << 6 | *pbVar12 & 0x3f;
          }
          uVar5 = uVar4;
          if ((uVar4 & 0xfffff800) == 0xd800) {
            uVar5 = 0xfffd;
          }
          if (uVar4 < 0x80) {
            uVar5 = 0xfffd;
          }
          if ((uVar4 & 0xfffffffe) == 0xfffe) {
            uVar5 = 0xfffd;
          }
        }
        iVar3 = fts5UnicodeIsAlnum((Unicode61Tokenizer *)pTokenizer,uVar5);
        pbVar8 = pbVar12;
        if (iVar3 != 0) {
          local_5c = local_5c - local_50;
          goto LAB_001f2114;
        }
      }
      if (pTokenizer[lVar6] != (Fts5Tokenizer)0x0) break;
      pbVar8 = pbVar8 + 1;
    }
    local_5c = local_5c - local_50;
    do {
      cVar1 = (char)lVar6;
      cVar7 = cVar1 + ' ';
      if (0x19 < (byte)(cVar1 + 0xbfU)) {
        cVar7 = cVar1;
      }
      *(char *)puVar9 = cVar7;
      puVar9 = (uint *)((long)puVar9 + 1);
      pbVar8 = pbVar8 + 1;
      while( true ) {
        pbVar12 = pbVar8;
        if (pbVar10 <= pbVar8) goto LAB_001f202e;
        if (local_48 < puVar9) {
          iVar3 = sqlite3_initialize();
          if (iVar3 != 0) {
            return 7;
          }
          iVar3 = (int)local_58;
          local_68 = (uint *)sqlite3Malloc((long)iVar3 * 2);
          if (local_68 == (uint *)0x0) {
            return 7;
          }
          puVar9 = (uint *)(((long)puVar9 - (long)*(void **)(pTokenizer + 0x80)) + (long)local_68);
          memcpy(local_68,*(void **)(pTokenizer + 0x80),(long)iVar3);
          sqlite3_free(*(void **)(pTokenizer + 0x80));
          *(uint **)(pTokenizer + 0x80) = local_68;
          uVar5 = iVar3 * 2;
          local_58 = (ulong)uVar5;
          *(uint *)(pTokenizer + 0x88) = uVar5;
          local_48 = (uint *)((long)local_68 + (long)(int)uVar5 + -6);
        }
        bVar2 = *pbVar8;
        lVar6 = (long)(char)bVar2;
        if (-1 < lVar6) break;
        uVar5 = (uint)bVar2;
        pbVar12 = pbVar8 + 1;
        if (0xbf < bVar2) {
          uVar4 = (uint)""[bVar2 - 0xc0];
          for (; (pbVar12 < pbVar10 && ((*pbVar12 & 0xffffffc0) == 0x80)); pbVar12 = pbVar12 + 1) {
            uVar4 = uVar4 << 6 | *pbVar12 & 0x3f;
          }
          uVar5 = uVar4;
          if ((uVar4 & 0xfffff800) == 0xd800) {
            uVar5 = 0xfffd;
          }
          if (uVar4 < 0x80) {
            uVar5 = 0xfffd;
          }
          if ((uVar4 & 0xfffffffe) == 0xfffe) {
            uVar5 = 0xfffd;
          }
        }
        iVar3 = fts5UnicodeIsAlnum((Unicode61Tokenizer *)pTokenizer,uVar5);
        if (iVar3 == 0) {
          if (uVar5 - 0x332 < 0xffffffce) goto LAB_001f202e;
          uVar4 = 0x361f8;
          if (uVar5 < 800) {
            uVar4 = 0x8029fdf;
          }
          if ((uVar4 >> (uVar5 - 0x20 & 0x1f) & 1) == 0) goto LAB_001f202e;
        }
LAB_001f2114:
        uVar5 = sqlite3Fts5UnicodeFold(uVar5,*(int *)(pTokenizer + 0x8c));
        pbVar8 = pbVar12;
        if (uVar5 != 0) {
          bVar2 = (byte)uVar5;
          if (uVar5 < 0x80) {
            *(byte *)puVar9 = bVar2;
            puVar9 = (uint *)((long)puVar9 + 1);
          }
          else if (uVar5 < 0x800) {
            *(byte *)puVar9 = (byte)(uVar5 >> 6) | 0xc0;
            *(byte *)((long)puVar9 + 1) = bVar2 & 0x3f | 0x80;
            puVar9 = (uint *)((long)puVar9 + 2);
          }
          else if (uVar5 < 0x10000) {
            *(byte *)puVar9 = (byte)(uVar5 >> 0xc) | 0xe0;
            *(byte *)((long)puVar9 + 1) = (byte)(uVar5 >> 6) & 0x3f | 0x80;
            *(byte *)((long)puVar9 + 2) = bVar2 & 0x3f | 0x80;
            puVar9 = (uint *)((long)puVar9 + 3);
          }
          else {
            *puVar9 = (uVar5 << 0x18 |
                      (uVar5 & 0x3fc0) << 10 | uVar5 >> 0x12 & 0xff | uVar5 >> 4 & 0xff00) &
                      (uint)DAT_00208f00 | (uint)DAT_00208f10;
            puVar9 = puVar9 + 1;
          }
        }
      }
    } while (pTokenizer[lVar6] != (Fts5Tokenizer)0x0);
LAB_001f202e:
    iVar3 = (*xToken)(pCtx,0,(char *)local_68,(int)puVar9 - (int)local_68,local_5c,
                      (int)pbVar8 - local_50);
    pbVar8 = pbVar12;
    if (iVar3 != 0) {
      iVar11 = 0;
      if (iVar3 != 0x65) {
        iVar11 = iVar3;
      }
      return iVar11;
    }
  } while( true );
}

Assistant:

static int fts5UnicodeTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int iUnused,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  Unicode61Tokenizer *p = (Unicode61Tokenizer*)pTokenizer;
  int rc = SQLITE_OK;
  unsigned char *a = p->aTokenChar;

  unsigned char *zTerm = (unsigned char*)&pText[nText];
  unsigned char *zCsr = (unsigned char *)pText;

  /* Output buffer */
  char *aFold = p->aFold;
  int nFold = p->nFold;
  const char *pEnd = &aFold[nFold-6];

  UNUSED_PARAM(iUnused);

  /* Each iteration of this loop gobbles up a contiguous run of separators,
  ** then the next token.  */
  while( rc==SQLITE_OK ){
    u32 iCode;                    /* non-ASCII codepoint read from input */
    char *zOut = aFold;
    int is;
    int ie;

    /* Skip any separator characters. */
    while( 1 ){
      if( zCsr>=zTerm ) goto tokenize_done;
      if( *zCsr & 0x80 ) {
        /* A character outside of the ascii range. Skip past it if it is
        ** a separator character. Or break out of the loop if it is not. */
        is = zCsr - (unsigned char*)pText;
        READ_UTF8(zCsr, zTerm, iCode);
        if( fts5UnicodeIsAlnum(p, iCode) ){
          goto non_ascii_tokenchar;
        }
      }else{
        if( a[*zCsr] ){
          is = zCsr - (unsigned char*)pText;
          goto ascii_tokenchar;
        }
        zCsr++;
      }
    }

    /* Run through the tokenchars. Fold them into the output buffer along
    ** the way.  */
    while( zCsr<zTerm ){

      /* Grow the output buffer so that there is sufficient space to fit the
      ** largest possible utf-8 character.  */
      if( zOut>pEnd ){
        aFold = sqlite3_malloc64((sqlite3_int64)nFold*2);
        if( aFold==0 ){
          rc = SQLITE_NOMEM;
          goto tokenize_done;
        }
        zOut = &aFold[zOut - p->aFold];
        memcpy(aFold, p->aFold, nFold);
        sqlite3_free(p->aFold);
        p->aFold = aFold;
        p->nFold = nFold = nFold*2;
        pEnd = &aFold[nFold-6];
      }

      if( *zCsr & 0x80 ){
        /* An non-ascii-range character. Fold it into the output buffer if
        ** it is a token character, or break out of the loop if it is not. */
        READ_UTF8(zCsr, zTerm, iCode);
        if( fts5UnicodeIsAlnum(p,iCode)||sqlite3Fts5UnicodeIsdiacritic(iCode) ){
 non_ascii_tokenchar:
          iCode = sqlite3Fts5UnicodeFold(iCode, p->eRemoveDiacritic);
          if( iCode ) WRITE_UTF8(zOut, iCode);
        }else{
          break;
        }
      }else if( a[*zCsr]==0 ){
        /* An ascii-range separator character. End of token. */
        break;
      }else{
 ascii_tokenchar:
        if( *zCsr>='A' && *zCsr<='Z' ){
          *zOut++ = *zCsr + 32;
        }else{
          *zOut++ = *zCsr;
        }
        zCsr++;
      }
      ie = zCsr - (unsigned char*)pText;
    }

    /* Invoke the token callback */
    rc = xToken(pCtx, 0, aFold, zOut-aFold, is, ie);
  }

 tokenize_done:
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  return rc;
}